

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

type fmt::v7::
     format_to<fmt::v7::detail::buffer_appender<char>,char[5],std::basic_string_view<char,std::char_traits<char>>const&,true>
               (buffer_appender<char> out,char (*format_str) [5],
               basic_string_view<char,_std::char_traits<char>_> *args)

{
  type tVar1;
  remove_reference_t<const_std::basic_string_view<char>_&> *in_RCX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_80;
  basic_string_view<char> local_70;
  v7 *local_60;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_58;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_48;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::basic_string_view<char,_std::char_traits<char>_>_>
  *vargs;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  char (*format_str_local) [5];
  buffer_appender<char> out_local;
  
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::basic_string_view<char,_std::char_traits<char>_>_>
           *)args;
  args_local = (basic_string_view<char,_std::char_traits<char>_> *)format_str;
  format_str_local =
       (char (*) [5])out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  local_58.named_args.data =
       (named_arg_info<char> *)
       make_args_checked<std::basic_string_view<char,std::char_traits<char>>const&,char[5],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *)format_str,(v7 *)args,(char (*) [5])args,in_RCX);
  local_48 = &local_58;
  local_60 = (v7 *)format_str_local;
  local_70 = to_string_view<char,_0>((char *)args_local);
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(&local_80,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_48->string);
  args_00.field_1.values_ = in_R8.values_;
  args_00.desc_ = (unsigned_long_long)local_80.field_1.values_;
  tVar1 = vformat_to<fmt::v7::detail::buffer_appender<char>,fmt::v7::basic_string_view<char>,char,true>
                    (local_60,(buffer_appender<char>)&local_70,
                     (basic_string_view<char> *)local_80.desc_,args_00);
  return (type)tVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

inline auto format_to(OutputIt out, const S& format_str, Args&&... args) ->
    typename std::enable_if<enable, OutputIt>::type {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return vformat_to(out, to_string_view(format_str), vargs);
}